

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

int __thiscall Map_Chest::DelSomeItem(Map_Chest *this,short item_id,int amount)

{
  int iVar1;
  int iVar2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  
  p_Var4 = (_List_node_base *)&this->items;
  do {
    p_Var4 = (((_List_base<Map_Chest_Item,_std::allocator<Map_Chest_Item>_> *)&p_Var4->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)&this->items) {
      return 0;
    }
  } while (*(short *)&p_Var4[1]._M_next != item_id);
  iVar2 = *(int *)((long)&p_Var4[1]._M_next + 4);
  iVar1 = iVar2 - amount;
  if (iVar1 != 0 && amount <= iVar2) {
    *(int *)((long)&p_Var4[1]._M_next + 4) = iVar1;
    if (*(int *)&p_Var4[1]._M_prev != 0) {
      p_Var5 = (_List_node_base *)Timer::GetTime();
      for (p_Var3 = (this->spawns).
                    super__List_base<Map_Chest_Spawn,_std::allocator<Map_Chest_Spawn>_>._M_impl.
                    _M_node.super__List_node_base._M_next;
          p_Var3 != (_List_node_base *)&this->spawns; p_Var3 = p_Var3->_M_next) {
        if (*(int *)&p_Var3[2]._M_next == *(int *)&p_Var4[1]._M_prev) {
          p_Var3[2]._M_prev = p_Var5;
        }
      }
      *(undefined4 *)&p_Var4[1]._M_prev = 0;
    }
    return *(int *)((long)&p_Var4[1]._M_next + 4);
  }
  iVar2 = DelItem(this,item_id);
  return iVar2;
}

Assistant:

int Map_Chest::DelSomeItem(short item_id, int amount)
{
	UTIL_IFOREACH(this->items, it)
	{
		if (it->id == item_id)
		{
			if (amount < it->amount)
			{
				it->amount -= amount;

				if (it->slot)
				{
					double current_time = Timer::GetTime();

					UTIL_FOREACH_REF(this->spawns, spawn)
					{
						if (spawn.slot == it->slot)
						{
							spawn.last_taken = current_time;
						}
					}

					it->slot = 0;
				}

				return it->amount;
			}
			else
			{
				return DelItem(item_id);
			}

			break;
		}
	}

	return 0;
}